

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O2

string * __thiscall
SequenceDistanceGraphPath::sequence_abi_cxx11_
          (string *__return_storage_ptr__,SequenceDistanceGraphPath *this)

{
  char cVar1;
  pointer plVar2;
  long *plVar3;
  pointer pvVar4;
  ostream *poVar5;
  pointer pLVar6;
  runtime_error *prVar7;
  long lVar8;
  int32_t c;
  uint uVar9;
  long lVar10;
  long *n_1;
  pointer plVar11;
  long *n;
  vector<long,_std::allocator<long>_> *__range2;
  long *plVar12;
  string nseq;
  value_type rcn;
  
  poVar5 = sdglib::OutputLog(DEBUG,true);
  std::operator<<(poVar5,"sequence for a SequenceDistanceGraphPath with nodes = [");
  if (sdglib::OutputLogLevel == 2) {
    plVar2 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar11 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start; plVar11 != plVar2; plVar11 = plVar11 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<long>((long)poVar5);
    }
    poVar5 = std::operator<<((ostream *)&std::cout," ]");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&rcn);
  plVar12 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  plVar3 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = 0;
  do {
    if (plVar12 == plVar3) {
      poVar5 = sdglib::OutputLog(DEBUG,true);
      std::operator<<(poVar5,
                      "sequence finished successfully for SequenceDistanceGraphPath with nodes = [")
      ;
      if (sdglib::OutputLogLevel == 2) {
        plVar2 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (plVar11 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start; plVar11 != plVar2; plVar11 = plVar11 + 1) {
          poVar5 = std::operator<<((ostream *)&std::cout," ");
          std::ostream::_M_insert<long>((long)poVar5);
        }
        poVar5 = std::operator<<((ostream *)&std::cout," ]");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      return __return_storage_ptr__;
    }
    nseq._M_dataplus._M_p = (pointer)&nseq.field_2;
    nseq._M_string_length = 0;
    nseq.field_2._M_local_buf[0] = '\0';
    if (*plVar12 < 1) {
      Node::Node(&rcn,(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start + -*plVar12);
      Node::make_rc(&rcn);
      std::__cxx11::string::_M_assign((string *)&nseq);
      std::__cxx11::string::~string((string *)&rcn);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&nseq);
    }
    if (lVar10 != 0) {
      lVar8 = -lVar10;
      if (0 < lVar10) {
        lVar8 = lVar10;
      }
      pvVar4 = (this->sg->super_DistanceGraph).links.
               super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar6 = pvVar4[lVar8].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        if (pLVar6 == *(pointer *)
                       ((long)&pvVar4[lVar8].super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                               .super__Vector_impl_data + 8)) {
          poVar5 = std::operator<<((ostream *)&std::cout,"can\'t find a link between ");
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          poVar5 = std::operator<<(poVar5," and ");
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          std::endl<char,std::char_traits<char>>(poVar5);
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"path has no link");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((pLVar6->source == lVar10) && (pLVar6->dest == *plVar12)) break;
        pLVar6 = pLVar6 + 1;
      }
      uVar9 = pLVar6->dist;
      if ((int)uVar9 < 1) {
        for (lVar10 = 0;
            cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p
                    [lVar10 + (__return_storage_ptr__->_M_string_length - (ulong)-uVar9)],
            cVar1 != '\0'; lVar10 = lVar10 + 1) {
          if (cVar1 != nseq._M_dataplus._M_p[lVar10]) {
            sprintf((char *)&rcn,"path overlap is invalid! (%d,%d,%d)",pLVar6->source,pLVar6->dest,
                    (ulong)uVar9);
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,(char *)&rcn);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        std::__cxx11::string::erase((ulong)&nseq,0);
      }
      else {
        for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    lVar10 = -*plVar12;
    std::__cxx11::string::~string((string *)&nseq);
    plVar12 = plVar12 + 1;
  } while( true );
}

Assistant:

std::string SequenceDistanceGraphPath::sequence() const {
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence for a SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout << " " << n;
        std::cout << " ]" << std::endl;
    }
    std::string s = "";
    sgNodeID_t pnode = 0;
    // just iterate over every node in path - contig names are converted to ids at construction
    for (auto &n:nodes) {
        std::string nseq;
        if (n>0){
            nseq = sg.nodes[n].sequence;
        } else {
            auto rcn = sg.nodes[-n];
            rcn.make_rc();
            nseq = rcn.sequence;
        }
        if (pnode !=0){
            //find link between pnode' output (+pnode) and n's sink (-n)
            auto l=sg.links[(pnode>0 ? pnode:-pnode)].begin();
            for (;l!=sg.links[(pnode>0 ? pnode:-pnode)].end();++l)
                if (l->source==pnode and l->dest==n) break;
            if (l==sg.links[(pnode>0 ? pnode:-pnode)].end()) {
                std::cout<<"can't find a link between "<<pnode<<" and "<<n<<std::endl;
                throw std::runtime_error("path has no link");
            } else {
                if (l->dist > 0){
                    for (auto c = l->dist; c > 0; --c) s += "N";
                }
                else {
                    auto ovl =- l->dist;
                    for (auto s1 = s.c_str() + s.size() - ovl, s2 = nseq.c_str(); *s1 != NULL; ++s1, ++s2)
                        if (*s1 != *s2) {
                            char buffer[250];
                            sprintf(buffer,"path overlap is invalid! (%d,%d,%d)",l->source,l->dest,l->dist);
                            throw std::runtime_error(buffer);
                        }
                    nseq.erase(0, ovl);
                }
            }
        }
        s+=nseq;
        pnode=-n;
    }
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence finished successfully for SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout<<" "<<n;
        std::cout<<" ]"<<std::endl;
    }
    return s;
}